

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_NVector_MultiFab.cpp
# Opt level: O2

void N_VLinearSum_MultiFab(Real a,N_Vector x,Real b,N_Vector y,N_Vector z)

{
  MultiFab *x_00;
  
  x_00 = *(MultiFab **)((long)x->content + 8);
  amrex::MultiFab::LinComb
            (*(MultiFab **)((long)z->content + 8),a,x_00,0,b,*(MultiFab **)((long)y->content + 8),0,
             0,(x_00->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp,0);
  return;
}

Assistant:

void N_VLinearSum_MultiFab(amrex::Real a, N_Vector x, amrex::Real b, N_Vector y,
                              N_Vector z)
{
    amrex::MultiFab *mf_x = amrex::sundials::getMFptr(x);
    amrex::MultiFab *mf_y = amrex::sundials::getMFptr(y);
    amrex::MultiFab *mf_z = amrex::sundials::getMFptr(z);

    sunindextype ncomp = mf_x->nComp();
    //sunindextype nghost = mf_x->nGrow();
    sunindextype nghost = 0;  // do not include ghost cells

    amrex::MultiFab::LinComb(*mf_z, a, *mf_x, 0, b, *mf_y, 0, 0, ncomp, nghost);
}